

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O2

UBool __thiscall
icu_63::TimeArrayTimeZoneRule::operator==(TimeArrayTimeZoneRule *this,TimeZoneRule *that)

{
  double *pdVar1;
  _func_int **pp_Var2;
  uint uVar3;
  bool bVar4;
  UBool UVar5;
  uint uVar6;
  ulong uVar7;
  
  if (this == (TimeArrayTimeZoneRule *)that) {
    return '\x01';
  }
  bVar4 = std::type_info::operator!=
                    ((type_info *)(this->super_TimeZoneRule).super_UObject._vptr_UObject[-1],
                     (type_info *)(that->super_UObject)._vptr_UObject[-1]);
  if (((bVar4) || (UVar5 = TimeZoneRule::operator==(&this->super_TimeZoneRule,that), UVar5 == '\0'))
     || (this->fTimeRuleType != *(TimeRuleType *)&that[1].super_UObject._vptr_UObject)) {
    uVar6 = 0;
  }
  else {
    uVar3 = this->fNumStartTimes;
    uVar6 = 0;
    if (uVar3 == *(uint *)((long)&that[1].super_UObject._vptr_UObject + 4)) {
      if ((int)uVar3 < 1) {
        uVar3 = uVar6;
      }
      uVar7 = 0;
      while (uVar3 != uVar7) {
        pdVar1 = this->fStartTimes + uVar7;
        uVar6 = 0;
        pp_Var2 = that[1].fName.super_Replaceable.super_UObject._vptr_UObject + uVar7;
        uVar7 = uVar7 + 1;
        if ((*pdVar1 != (double)*pp_Var2) || (NAN(*pdVar1) || NAN((double)*pp_Var2)))
        goto LAB_0020e727;
      }
      uVar6 = 1;
    }
  }
LAB_0020e727:
  return (UBool)uVar6;
}

Assistant:

UBool
TimeArrayTimeZoneRule::operator==(const TimeZoneRule& that) const {
    if (this == &that) {
        return TRUE;
    }
    if (typeid(*this) != typeid(that) || TimeZoneRule::operator==(that) == FALSE) {
        return FALSE;
    }
    TimeArrayTimeZoneRule *tatzr = (TimeArrayTimeZoneRule*)&that;
    if (fTimeRuleType != tatzr->fTimeRuleType ||
        fNumStartTimes != tatzr->fNumStartTimes) {
        return FALSE;
    }
    // Compare start times
    UBool res = TRUE;
    for (int32_t i = 0; i < fNumStartTimes; i++) {
        if (fStartTimes[i] != tatzr->fStartTimes[i]) {
            res = FALSE;
            break;
        }
    }
    return res;
}